

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O0

tnt_request * tnt_request_init(tnt_request *req)

{
  tnt_request *ptStack_18;
  int alloc;
  tnt_request *req_local;
  
  ptStack_18 = req;
  if ((req == (tnt_request *)0x0) &&
     (ptStack_18 = (tnt_request *)tnt_mem_alloc(0x60), ptStack_18 == (tnt_request *)0x0)) {
    req_local = (tnt_request *)0x0;
  }
  else {
    memset(ptStack_18,0,0x60);
    ptStack_18->limit = 0xffffffff;
    ptStack_18->alloc = (uint)(req == (tnt_request *)0x0);
    req_local = ptStack_18;
  }
  return req_local;
}

Assistant:

struct tnt_request *tnt_request_init(struct tnt_request *req) {
	int alloc = (req == NULL);
	if (req == NULL) {
		req = tnt_mem_alloc(sizeof(struct tnt_request));
		if (!req) return NULL;
	}
	memset(req, 0, sizeof(struct tnt_request));
	req->limit = UINT32_MAX;
	req->alloc = alloc;
	return req;
}